

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eccommit_impl.h
# Opt level: O0

int secp256k1_ec_commit_pubkey_serialize_const(secp256k1_ge *pubp,uchar *buf33)

{
  uchar uVar1;
  int iVar2;
  uchar *buf33_local;
  secp256k1_ge *pubp_local;
  
  iVar2 = secp256k1_ge_is_infinity(pubp);
  if (iVar2 == 0) {
    secp256k1_fe_normalize(&pubp->x);
    secp256k1_fe_normalize(&pubp->y);
    secp256k1_fe_get_b32(buf33 + 1,&pubp->x);
    iVar2 = secp256k1_fe_is_odd(&pubp->y);
    uVar1 = '\x02';
    if (iVar2 != 0) {
      uVar1 = '\x03';
    }
    *buf33 = uVar1;
    pubp_local._4_4_ = 1;
  }
  else {
    pubp_local._4_4_ = 0;
  }
  return pubp_local._4_4_;
}

Assistant:

static int secp256k1_ec_commit_pubkey_serialize_const(secp256k1_ge *pubp, unsigned char *buf33) {
    if (secp256k1_ge_is_infinity(pubp)) {
        return 0;
    }
    secp256k1_fe_normalize(&pubp->x);
    secp256k1_fe_normalize(&pubp->y);
    secp256k1_fe_get_b32(&buf33[1], &pubp->x);
    buf33[0] = secp256k1_fe_is_odd(&pubp->y) ? SECP256K1_TAG_PUBKEY_ODD : SECP256K1_TAG_PUBKEY_EVEN;
    return 1;
}